

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

bool __thiscall ON_LineCurve::Extend(ON_LineCurve *this,ON_Interval *domain)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double *pdVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  ON_3dPoint Q1;
  ON_3dPoint Q0;
  ON_3dVector V;
  undefined4 local_d8;
  undefined4 local_d0;
  ON_3dPoint local_b8;
  ON_3dPoint local_98;
  ON_Line local_80;
  ON_Interval local_50;
  ON_3dVector local_40;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  dVar3 = ON_Interval::Length((ON_Interval *)&local_80);
  ON_Line::Direction(&local_40,&this->m_line);
  local_98.z = (this->m_line).from.z;
  local_98.x = (this->m_line).from.x;
  local_98.y = (this->m_line).from.y;
  local_b8.z = (this->m_line).to.z;
  local_b8.x._0_4_ = *(undefined4 *)&(this->m_line).to.x;
  local_b8.x._4_4_ = *(undefined4 *)((long)&(this->m_line).to.x + 4);
  local_b8.y._0_4_ = *(undefined4 *)&(this->m_line).to.y;
  local_b8.y._4_4_ = *(undefined4 *)((long)&(this->m_line).to.y + 4);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar7 = ON_Interval::operator[]((ON_Interval *)&local_80,0);
  local_d0 = SUB84(*pdVar7,0);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar7 = ON_Interval::operator[]((ON_Interval *)&local_80,1);
  local_d8 = SUB84(*pdVar7,0);
  dVar4 = ON_Interval::operator[](domain,1);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  pdVar7 = ON_Interval::operator[]((ON_Interval *)&local_80,1);
  bVar1 = dVar4 != *pdVar7;
  bVar2 = *pdVar7 <= dVar4;
  if (bVar2 && bVar1) {
    dVar4 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    pdVar7 = ON_Interval::operator[](&local_50,1);
    ::operator*((ON_3dVector *)&local_80,(dVar4 - *pdVar7) / dVar3,&local_40);
    ON_3dPoint::operator+=(&local_b8,(ON_3dVector *)&local_80);
    dVar4 = ON_Interval::operator[](domain,1);
    local_d8 = SUB84(dVar4,0);
  }
  dVar5 = ON_Interval::operator[](domain,0);
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
  local_80.from.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  local_80.from.y = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  pdVar7 = ON_Interval::operator[]((ON_Interval *)&local_80,0);
  dVar4 = *pdVar7;
  if (dVar5 < dVar4) {
    dVar6 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    pdVar7 = ON_Interval::operator[](&local_50,0);
    ::operator*((ON_3dVector *)&local_80,(dVar6 - *pdVar7) / dVar3,&local_40);
    ON_3dPoint::operator+=(&local_98,(ON_3dVector *)&local_80);
    dVar3 = ON_Interval::operator[](domain,0);
    local_d0 = SUB84(dVar3,0);
  }
  if (dVar5 < dVar4 || bVar2 && bVar1) {
    to_pt.x._4_4_ = local_b8.x._4_4_;
    to_pt.x._0_4_ = local_b8.x._0_4_;
    to_pt.y._4_4_ = local_b8.y._4_4_;
    to_pt.y._0_4_ = local_b8.y._0_4_;
    from_pt.y = local_98.y;
    from_pt.x = local_98.x;
    from_pt.z = local_98.z;
    to_pt.z = local_b8.z;
    ON_Line::ON_Line(&local_80,from_pt,to_pt);
    (this->m_line).to.y = local_80.to.y;
    (this->m_line).to.z = local_80.to.z;
    (this->m_line).from.z = local_80.from.z;
    (this->m_line).to.x = local_80.to.x;
    (this->m_line).from.x = local_80.from.x;
    (this->m_line).from.y = local_80.from.y;
    ON_Line::~ON_Line(&local_80);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (local_d0,local_d8,this);
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  }
  return dVar5 < dVar4 || bVar2 && bVar1;
}

Assistant:

bool ON_LineCurve::Extend(
  const ON_Interval& domain
  )

{
  double len = Domain().Length();
  ON_3dVector V = m_line.Direction();
  ON_3dPoint Q0 = m_line.from;
  ON_3dPoint Q1 = m_line.to;
  double t0 = Domain()[0];
  double t1 = Domain()[1];
  bool do_it = false;
  if (domain[1] > Domain()[1]) {
    Q1 += (domain[1]-Domain()[1])/len*V;
    t1 = domain[1];
    do_it = true;
  }
  if (domain[0] < Domain()[0]) {
    Q0 += (domain[0]-Domain()[0])/len*V;
    t0 = domain[0];
    do_it = true;
  }

  if (do_it){
    m_line = ON_Line(Q0, Q1);
    SetDomain(t0, t1);
    DestroyCurveTree();
  }
  return do_it;
}